

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseCallOffset(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  int iVar7;
  undefined4 uVar8;
  bool bVar9;
  bool bVar10;
  ComplexityGuard guard;
  ParseState copy;
  ParseState copy_1;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  if (iVar3 < 0x20000 && iVar2 < 0x100) {
    uVar4 = (state->parse_state).mangled_idx;
    uVar5 = (state->parse_state).out_cur_idx;
    uVar6 = *(undefined8 *)&(state->parse_state).prev_name_idx;
    bVar9 = ParseOneCharToken(state,'h');
    if (bVar9) {
      iVar2 = state->recursion_depth;
      iVar3 = state->steps;
      state->recursion_depth = iVar2 + 1;
      state->steps = iVar3 + 1;
      if (iVar3 < 0x20000 && iVar2 < 0x100) {
        bVar9 = ParseNumber(state,(int *)0x0);
        state->recursion_depth = state->recursion_depth + -1;
        if (bVar9) {
          bVar9 = ParseOneCharToken(state,'_');
          bVar10 = true;
          if (bVar9) goto LAB_0027f0ed;
        }
      }
      else {
        state->recursion_depth = state->recursion_depth + -1;
      }
    }
    pPVar1 = &state->parse_state;
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
    bVar9 = ParseOneCharToken(state,'v');
    if (bVar9) {
      iVar2 = state->recursion_depth;
      iVar3 = state->steps;
      state->recursion_depth = iVar2 + 1;
      state->steps = iVar3 + 1;
      if (iVar3 < 0x20000 && iVar2 < 0x100) {
        iVar2 = pPVar1->mangled_idx;
        iVar3 = pPVar1->out_cur_idx;
        iVar7 = (state->parse_state).prev_name_idx;
        uVar8 = *(undefined4 *)&(state->parse_state).field_0xc;
        bVar9 = ParseNumber(state,(int *)0x0);
        if (((bVar9) && (bVar9 = ParseOneCharToken(state,'_'), bVar9)) &&
           (bVar9 = ParseNumber(state,(int *)0x0), bVar9)) {
          state->recursion_depth = state->recursion_depth + -1;
          bVar9 = ParseOneCharToken(state,'_');
          bVar10 = true;
          if (bVar9) goto LAB_0027f0ed;
          goto LAB_0027f0e3;
        }
        pPVar1->mangled_idx = iVar2;
        pPVar1->out_cur_idx = iVar3;
        (state->parse_state).prev_name_idx = iVar7;
        *(undefined4 *)&(state->parse_state).field_0xc = uVar8;
      }
      state->recursion_depth = state->recursion_depth + -1;
    }
LAB_0027f0e3:
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
  }
  bVar10 = false;
LAB_0027f0ed:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar10;
}

Assistant:

static bool ParseCallOffset(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'h') && ParseNVOffset(state) &&
      ParseOneCharToken(state, '_')) {
    return true;
  }
  state->parse_state = copy;

  if (ParseOneCharToken(state, 'v') && ParseVOffset(state) &&
      ParseOneCharToken(state, '_')) {
    return true;
  }
  state->parse_state = copy;

  return false;
}